

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O1

void __thiscall
DReachabilityPropagator::reverseDFStoBorder
          (DReachabilityPropagator *this,int u,vector<bool,_std::allocator<bool>_> *v,
          vector<bool,_std::allocator<bool>_> *my_side,vec<Lit> *expl,int skip_n)

{
  ulong *puVar1;
  uint uVar2;
  pointer pvVar3;
  uint *puVar4;
  BoolView *pBVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint *puVar9;
  Lit local_54;
  vec<Lit> *local_50;
  vector<bool,_std::allocator<bool>_> *local_48;
  ulong local_40;
  vector<bool,_std::allocator<bool>_> *local_38;
  
  uVar7 = (ulong)u;
  uVar8 = uVar7 + 0x3f;
  if (-1 < (long)uVar7) {
    uVar8 = uVar7;
  }
  puVar1 = (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start
           .super__Bit_iterator_base._M_p +
           ((long)uVar8 >> 6) +
           (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)u & 0x3f);
  pvVar3 = (this->in).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = *(uint **)&pvVar3[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
  puVar4 = (uint *)pvVar3[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  if (puVar9 != puVar4) {
    local_40 = 0x800000000000003f;
    local_50 = expl;
    local_48 = my_side;
    local_38 = v;
    do {
      uVar2 = *puVar9;
      pBVar5 = (this->super_GraphPropagator).es.data;
      if ((sat.assigns.data[(uint)pBVar5[uVar2].v] == '\0') ||
         ((uint)pBVar5[uVar2].s * 2 + -1 != (int)sat.assigns.data[(uint)pBVar5[uVar2].v])) {
LAB_001d17b6:
        iVar6 = *(this->super_GraphPropagator).endnodes.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        uVar8 = (ulong)iVar6;
        if (iVar6 != skip_n) {
          uVar7 = uVar8 + 0x3f;
          if (-1 < (long)uVar8) {
            uVar7 = uVar8;
          }
          if (((local_38->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar7 >> 6) +
                (ulong)((uVar8 & local_40) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar8 & 0x3f) & 1) == 0) {
            reverseDFStoBorder(this,iVar6,local_38,local_48,local_50,skip_n);
          }
        }
      }
      else {
        iVar6 = (*(this->lt->super_LengauerTarjan)._vptr_LengauerTarjan[7])
                          (this->lt,(ulong)**(uint **)&(this->super_GraphPropagator).endnodes.
                                                                                                              
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(int)uVar2].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data);
        if ((char)iVar6 == '\0') goto LAB_001d17b6;
        uVar7 = (ulong)*(this->super_GraphPropagator).endnodes.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
        uVar8 = uVar7 + 0x3f;
        if (-1 < (long)uVar7) {
          uVar8 = uVar7;
        }
        if (((local_48->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
             ._M_start.super__Bit_iterator_base._M_p
             [((long)uVar8 >> 6) +
              (ulong)((uVar7 & local_40) < 0x8000000000000001) + 0xffffffffffffffff] >>
             (uVar7 & 0x3f) & 1) != 0) goto LAB_001d17b6;
        uVar2 = (this->super_GraphPropagator).es.data[uVar2].v;
        local_54.x = (uint)((int)sat.assigns.data[uVar2] - 1U < 0xfffffffd) + uVar2 * 2;
        vec<Lit>::push(local_50,&local_54);
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar4);
  }
  return;
}

Assistant:

void DReachabilityPropagator::reverseDFStoBorder(int u, std::vector<bool>& v,
																								 std::vector<bool>& my_side, vec<Lit>& expl,
																								 int skip_n) {
	if (DEBUG) {
		std::cout << "Reverse DFS to border from " << u << '\n';
	}
	v[u] = true;
	for (const int ie : in[u]) {
		if (getEdgeVar(ie).isFixed() && getEdgeVar(ie).isFalse() && lt->visited_dfs(getTail(ie)) &&
				!my_side[getTail(ie)]) {
			expl.push(getEdgeVar(ie).getValLit());
			if (DEBUG) {
				std::cout << "Added to explanation for dom/bridge edge:" << ie << '\n';
			}
		} else {
			const int o = getTail(ie);
			if (o == skip_n || v[o]) {
				continue;
			}
			reverseDFStoBorder(o, v, my_side, expl, skip_n);
		}
	}
}